

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

vector<CPubKey,_std::allocator<CPubKey>_> *
Vector<CPubKey>(vector<CPubKey,_std::allocator<CPubKey>_> *__return_storage_ptr__,CPubKey *args)

{
  long lVar1;
  iterator __position;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<CPubKey,_std::allocator<CPubKey>_>::reserve(__return_storage_ptr__,1);
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CPubKey,_std::allocator<CPubKey>_>::_M_realloc_insert<CPubKey>
              (__return_storage_ptr__,__position,args);
  }
  else {
    memcpy(__position._M_current,args,0x41);
    (__return_storage_ptr__->super__Vector_base<CPubKey,_std::allocator<CPubKey>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}